

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

bool __thiscall helics::TimeCoordinator::updateNextExecutionTime(TimeCoordinator *this)

{
  long lVar1;
  long lVar2;
  Time testTime;
  long lVar3;
  long lVar4;
  
  lVar1 = (this->time_exec).internalTimeCode;
  if ((this->info).uninterruptible == true) {
    if (this->iterating == NO_ITERATIONS) {
LAB_0029edf9:
      testTime.internalTimeCode = (this->time_requested).internalTimeCode;
      goto LAB_0029ee7f;
    }
    lVar3 = 0x7fffffffffffffff;
    lVar2 = (this->time_message).internalTimeCode;
    lVar4 = (this->time_value).internalTimeCode;
    if (lVar4 < lVar2) {
      lVar2 = lVar4;
    }
    (this->time_exec).internalTimeCode = lVar2;
    if (lVar2 != 0x7fffffffffffffff) {
      lVar3 = lVar2 + (this->info).inputDelay.internalTimeCode;
      (this->time_exec).internalTimeCode = lVar3;
    }
    testTime.internalTimeCode = (this->time_granted).internalTimeCode;
    if (testTime.internalTimeCode < lVar3) goto LAB_0029edf9;
  }
  else {
    lVar2 = (this->time_value).internalTimeCode;
    lVar4 = (this->time_message).internalTimeCode;
    if (lVar2 < lVar4) {
      lVar4 = lVar2;
    }
    lVar2 = (this->info).inputDelay.internalTimeCode + lVar4;
    if (lVar4 == 0x7fffffffffffffff) {
      lVar2 = 0x7fffffffffffffff;
    }
    testTime.internalTimeCode = (this->time_granted).internalTimeCode;
    lVar4 = (this->time_requested).internalTimeCode;
    if (lVar4 <= lVar2) {
      lVar2 = lVar4;
    }
    (this->time_exec).internalTimeCode = lVar2;
    lVar4 = testTime.internalTimeCode;
    if (testTime.internalTimeCode < lVar2) {
LAB_0029ee7a:
      testTime.internalTimeCode = lVar2;
      if (testTime.internalTimeCode <= lVar4) goto LAB_0029ee91;
    }
    else {
      if (this->iterating == NO_ITERATIONS) {
        testTime = getNextPossibleTime(this);
        lVar4 = (this->time_granted).internalTimeCode;
      }
      (this->time_exec).internalTimeCode = testTime.internalTimeCode;
      lVar2 = testTime.internalTimeCode;
      if (lVar4 != 0x7fffffffffffffff) goto LAB_0029ee7a;
    }
LAB_0029ee7f:
    testTime = generateAllowedTime(this,testTime);
  }
  (this->time_exec).internalTimeCode = testTime.internalTimeCode;
LAB_0029ee91:
  return testTime.internalTimeCode != lVar1;
}

Assistant:

bool TimeCoordinator::updateNextExecutionTime()
{
    auto cexec = time_exec;
    if (info.uninterruptible) {
        if (iterating == IterationRequest::NO_ITERATIONS) {
            time_exec = generateAllowedTime(time_requested);
        } else {
            time_exec = std::min(time_message, time_value);
            if (time_exec < Time::maxVal()) {
                time_exec += info.inputDelay;
            }
            time_exec =
                (time_exec <= time_granted) ? time_granted : generateAllowedTime(time_requested);
        }
    } else {
        time_exec = std::min(time_message, time_value);
        if (time_exec < Time::maxVal()) {
            time_exec += info.inputDelay;
        }
        time_exec = std::min(time_requested, time_exec);
        if (time_exec <= time_granted) {
            time_exec = (iterating == IterationRequest::NO_ITERATIONS) ? getNextPossibleTime() :
                                                                         time_granted;
        }
        if (time_granted < Time::maxVal()) {
            if (time_exec > time_granted) {
                time_exec = generateAllowedTime(time_exec);
            }
        } else {
            time_exec = generateAllowedTime(time_exec);
        }
    }

    return (time_exec != cexec);
}